

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForEnum
          (Generator *this,EnumDescriptor *enum_descriptor)

{
  long lVar1;
  bool bVar2;
  Printer *printer;
  Printer *printer_00;
  long lVar3;
  long lVar4;
  string value_options;
  string descriptor_name;
  string enum_options;
  string local_50;
  
  ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>(&descriptor_name,this,enum_descriptor)
  ;
  MessageLite::SerializeAsString_abi_cxx11_
            (&value_options,*(MessageLite **)(enum_descriptor + 0x20));
  OptionsValue(&enum_options,this,&value_options);
  std::__cxx11::string::~string((string *)&value_options);
  bVar2 = std::operator!=(&enum_options,"None");
  if (bVar2) {
    anon_unknown_0::PrintDescriptorOptionsFixingCode
              (&descriptor_name,(string *)this->printer_,printer);
  }
  lVar3 = 0x20;
  for (lVar4 = 0; lVar4 < *(int *)(enum_descriptor + 0x2c); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(enum_descriptor + 0x30);
    MessageLite::SerializeAsString_abi_cxx11_(&local_50,*(MessageLite **)(lVar1 + lVar3));
    OptionsValue(&value_options,this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    bVar2 = std::operator!=(&value_options,"None");
    if (bVar2) {
      StringPrintf_abi_cxx11_
                (&local_50,"%s.values_by_name[\"%s\"]",descriptor_name._M_dataplus._M_p,
                 **(undefined8 **)(lVar1 + -0x20 + lVar3));
      anon_unknown_0::PrintDescriptorOptionsFixingCode
                (&local_50,(string *)this->printer_,printer_00);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&value_options);
    lVar3 = lVar3 + 0x28;
  }
  std::__cxx11::string::~string((string *)&enum_options);
  std::__cxx11::string::~string((string *)&descriptor_name);
  return;
}

Assistant:

void Generator::FixOptionsForEnum(const EnumDescriptor& enum_descriptor) const {
  std::string descriptor_name = ModuleLevelDescriptorName(enum_descriptor);
  std::string enum_options =
      OptionsValue(enum_descriptor.options().SerializeAsString());
  if (enum_options != "None") {
    PrintDescriptorOptionsFixingCode(descriptor_name, enum_options, printer_);
  }
  for (int i = 0; i < enum_descriptor.value_count(); ++i) {
    const EnumValueDescriptor& value_descriptor = *enum_descriptor.value(i);
    std::string value_options =
        OptionsValue(value_descriptor.options().SerializeAsString());
    if (value_options != "None") {
      PrintDescriptorOptionsFixingCode(
          StringPrintf("%s.values_by_name[\"%s\"]", descriptor_name.c_str(),
                       value_descriptor.name().c_str()),
          value_options, printer_);
    }
  }
}